

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O1

int countargs(char *cmdline)

{
  ushort **ppuVar1;
  char *pcVar2;
  int iVar3;
  
  if (*cmdline == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      ppuVar1 = __ctype_b_loc();
      cmdline = cmdline + -1;
      do {
        pcVar2 = cmdline;
        cmdline = pcVar2 + 1;
      } while ((*(byte *)((long)*ppuVar1 + (ulong)(byte)pcVar2[1] * 2 + 1) & 0x20) != 0);
      if (pcVar2[1] != 0) {
        iVar3 = iVar3 + 1;
        __ctype_b_loc();
        cmdline = pcVar2 + 2;
      }
    } while (*cmdline != '\0');
  }
  return iVar3;
}

Assistant:

int countargs(const char *cmdline)
{
    const char *p = cmdline;
    int                     state = 0;
    int                     argc = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            argc++;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                p++, state = 0;                       /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                p++;                                    /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote */
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            p++; state = 3;
            break;
        }
    }

    return argc;
}